

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

bool __thiscall QPDF::checkLinearizationInternal(QPDF *this)

{
  QPDFObjectHandle *this_00;
  bool bVar1;
  long lVar2;
  _Rb_tree_header *p_Var3;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar4;
  uint uVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  mapped_type *this_01;
  long *plVar9;
  QPDFObjGen *pQVar10;
  undefined8 *puVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  pointer pQVar14;
  const_iterator cVar15;
  mapped_type *pmVar16;
  logic_error *this_02;
  ulong *puVar17;
  QPDFObjGen QVar18;
  ulong uVar19;
  Members *pMVar20;
  ulong uVar21;
  char cVar22;
  Members *pMVar23;
  ulong uVar24;
  pointer pQVar25;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var26;
  type ii;
  uint uVar27;
  ulong uVar28;
  string_view msg;
  string_view msg_00;
  string_view msg_01;
  string_view msg_02;
  string_view msg_03;
  string_view msg_04;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> shared_idx_to_obj;
  string __str;
  QPDFObjGen og;
  string __str_2;
  string __str_4;
  string __str_5;
  string __str_3;
  undefined1 local_178 [8];
  undefined1 local_170 [24];
  QPDFObjGen local_158;
  size_t local_150;
  ulong *local_148;
  long local_140;
  ulong local_138;
  long lStack_130;
  long *local_128;
  undefined8 local_120;
  long local_118;
  undefined8 uStack_110;
  QPDFObjGen local_108;
  QPDFObjGen local_100;
  ulong local_f8;
  QPDFObjGen QStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  Members *local_c8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  _Var26._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  local_c0 = getAllPages(this);
  this_00 = (local_c0->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((local_c0->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish == this_00) {
    uVar24 = 0;
    uVar28 = 0;
  }
  else {
    iVar8 = *(int *)((long)&(_Var26._M_head_impl)->linp + 8);
    iVar7 = QPDFObjectHandle::getObjectID(this_00);
    if (iVar8 != iVar7) {
      msg._M_str = "first page object (/O) mismatch";
      msg._M_len = 0x1f;
      linearizationWarning(this,msg);
    }
    uVar21 = (long)(local_c0->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_c0->
                   super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    uVar28 = (long)uVar21 >> 4;
    if ((uVar28 & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar28);
    }
    iVar8 = (int)uVar28;
    local_c8 = _Var26._M_head_impl;
    if (*(int *)((long)&(_Var26._M_head_impl)->linp + 0x18) != iVar8) {
      msg_00._M_str = "page count (/N) mismatch";
      msg_00._M_len = 0x18;
      linearizationWarning(this,msg_00);
    }
    pvVar4 = local_c0;
    uVar24 = 0;
    while( true ) {
      if (iVar8 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
      }
      if (uVar24 == (long)(int)(uVar21 >> 4)) {
        plVar9 = *(long **)&(((this->m)._M_t.
                              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                              .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
        (**(code **)(*plVar9 + 0x28))(plVar9,(local_c8->linp).xref_zero_offset,0);
        goto LAB_00212ab8;
      }
      pQVar25 = (pvVar4->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar28 = (long)(pvVar4->
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pQVar25 >> 4;
      if (uVar28 <= uVar24) break;
      local_108 = QPDFObjectHandle::getObjGen(pQVar25 + uVar24);
      this_01 = std::
                map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                ::operator[](&((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              xref_table,&local_108);
      iVar7 = QPDFXRefEntry::getType(this_01);
      if (iVar7 == 2) {
        cVar22 = '\x01';
        if (9 < uVar24) {
          uVar28 = uVar24;
          cVar6 = '\x04';
          do {
            cVar22 = cVar6;
            if (uVar28 < 100) {
              cVar22 = cVar22 + -2;
              goto LAB_00212936;
            }
            if (uVar28 < 1000) {
              cVar22 = cVar22 + -1;
              goto LAB_00212936;
            }
            if (uVar28 < 10000) goto LAB_00212936;
            bVar1 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar6 = cVar22 + '\x04';
          } while (bVar1);
          cVar22 = cVar22 + '\x01';
        }
LAB_00212936:
        local_128 = &local_118;
        std::__cxx11::string::_M_construct((ulong)&local_128,cVar22);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_128,(uint)local_120,uVar24);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x27e55f);
        local_148 = &local_138;
        puVar17 = (ulong *)(plVar9 + 2);
        if ((ulong *)*plVar9 == puVar17) {
          local_138 = *puVar17;
          lStack_130 = plVar9[3];
        }
        else {
          local_138 = *puVar17;
          local_148 = (ulong *)*plVar9;
        }
        local_140 = plVar9[1];
        *plVar9 = (long)puVar17;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pQVar10 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_148);
        local_178 = (undefined1  [8])((long)local_170 + 8);
        QVar18 = (QPDFObjGen)(pQVar10 + 2);
        if (*pQVar10 == QVar18) {
          local_170._8_8_ = *(undefined8 *)QVar18;
          local_170._16_8_ = pQVar10[3];
        }
        else {
          local_170._8_8_ = *(undefined8 *)QVar18;
          local_178 = (undefined1  [8])*pQVar10;
        }
        local_170._0_8_ = pQVar10[1];
        *pQVar10 = QVar18;
        pQVar10[1].obj = 0;
        pQVar10[1].gen = 0;
        *(undefined1 *)&pQVar10[2].obj = 0;
        msg_01._M_str = (char *)local_178;
        msg_01._M_len._0_4_ = (int)local_170._0_8_;
        msg_01._M_len._4_4_ = SUB84(local_170._0_8_,4);
        linearizationWarning(this,msg_01);
        if (local_178 != (undefined1  [8])((long)local_170 + 8)) {
          operator_delete((void *)local_178,(ulong)(local_170._8_8_ + 1));
        }
        if (local_148 != &local_138) {
          operator_delete(local_148,local_138 + 1);
        }
        if (local_128 != &local_118) {
          operator_delete(local_128,local_118 + 1);
        }
      }
      uVar24 = uVar24 + 1;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar24,
             uVar28);
  while ((0x100002400U >> ((ulong)local_178 & 0x3f) & 1) != 0) {
LAB_00212ab8:
    plVar9 = *(long **)&(((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                        super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
    (**(code **)(*plVar9 + 0x38))(plVar9,local_178,1);
    if (0x20 < ((ulong)local_178 & 0xff)) break;
  }
  plVar9 = *(long **)&(((this->m)._M_t.
                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>;
  uVar27 = 1;
  (**(code **)(*plVar9 + 0x28))(plVar9,0xffffffffffffffff,1);
  uVar24 = (**(code **)(**(long **)&(((this->m)._M_t.
                                      super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                      .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                                    file).
                                    super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                       0x20))();
  _Var26._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  uVar28 = (_Var26._M_head_impl)->first_xref_item_offset;
  if (uVar24 != uVar28) {
    uVar24 = -uVar28;
    if (0 < (long)uVar28) {
      uVar24 = uVar28;
    }
    if (9 < uVar24) {
      uVar21 = uVar24;
      uVar5 = 4;
      do {
        uVar27 = uVar5;
        if (uVar21 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_00212b8f;
        }
        if (uVar21 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_00212b8f;
        }
        if (uVar21 < 10000) goto LAB_00212b8f;
        bVar1 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        uVar5 = uVar27 + 4;
      } while (bVar1);
      uVar27 = uVar27 + 1;
    }
LAB_00212b8f:
    local_108 = (QPDFObjGen)&local_f8;
    std::__cxx11::string::_M_construct
              ((ulong)&local_108,(char)uVar27 - (char)((long)uVar28 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_108 - ((long)uVar28 >> 0x3f)),uVar27,uVar24);
    puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_108,0,(char *)0x0,0x27e588);
    local_128 = &local_118;
    plVar9 = puVar11 + 2;
    if ((long *)*puVar11 == plVar9) {
      local_118 = *plVar9;
      uStack_110 = puVar11[3];
    }
    else {
      local_118 = *plVar9;
      local_128 = (long *)*puVar11;
    }
    local_120 = puVar11[1];
    *puVar11 = plVar9;
    puVar11[1] = 0;
    *(undefined1 *)(puVar11 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
    puVar17 = (ulong *)(plVar9 + 2);
    if ((ulong *)*plVar9 == puVar17) {
      local_138 = *puVar17;
      lStack_130 = plVar9[3];
      local_148 = &local_138;
    }
    else {
      local_138 = *puVar17;
      local_148 = (ulong *)*plVar9;
    }
    local_140 = plVar9[1];
    *plVar9 = (long)puVar17;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    uVar24 = (**(code **)(**(long **)&(((this->m)._M_t.
                                        super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                        .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->file).
                                      super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> +
                         0x20))();
    uVar28 = -uVar24;
    if (0 < (long)uVar24) {
      uVar28 = uVar24;
    }
    uVar27 = 1;
    if (9 < uVar28) {
      uVar21 = uVar28;
      uVar5 = 4;
      do {
        uVar27 = uVar5;
        if (uVar21 < 100) {
          uVar27 = uVar27 - 2;
          goto LAB_00212cfd;
        }
        if (uVar21 < 1000) {
          uVar27 = uVar27 - 1;
          goto LAB_00212cfd;
        }
        if (uVar21 < 10000) goto LAB_00212cfd;
        bVar1 = 99999 < uVar21;
        uVar21 = uVar21 / 10000;
        uVar5 = uVar27 + 4;
      } while (bVar1);
      uVar27 = uVar27 + 1;
    }
LAB_00212cfd:
    local_e8 = &local_d8;
    std::__cxx11::string::_M_construct((ulong)&local_e8,(char)uVar27 - (char)((long)uVar24 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((char *)((long)local_e8 - ((long)uVar24 >> 0x3f)),uVar27,uVar28);
    uVar28 = 0xf;
    if (local_148 != &local_138) {
      uVar28 = local_138;
    }
    if (uVar28 < (ulong)(local_e0 + local_140)) {
      uVar28 = 0xf;
      if (local_e8 != &local_d8) {
        uVar28 = local_d8;
      }
      if (uVar28 < (ulong)(local_e0 + local_140)) goto LAB_00212d91;
      pQVar10 = (QPDFObjGen *)
                std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_148);
    }
    else {
LAB_00212d91:
      pQVar10 = (QPDFObjGen *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_e8);
    }
    QVar18 = (QPDFObjGen)(pQVar10 + 2);
    if (*pQVar10 == QVar18) {
      local_170._8_8_ = *(undefined8 *)QVar18;
      local_170._16_8_ = pQVar10[3];
      local_178 = (undefined1  [8])((long)local_170 + 8);
    }
    else {
      local_170._8_8_ = *(undefined8 *)QVar18;
      local_178 = (undefined1  [8])*pQVar10;
    }
    local_170._0_8_ = pQVar10[1];
    *pQVar10 = QVar18;
    pQVar10[1].obj = 0;
    pQVar10[1].gen = 0;
    *(undefined1 *)QVar18 = 0;
    msg_02._M_str = (char *)local_178;
    msg_02._M_len._0_4_ = (int)local_170._0_8_;
    msg_02._M_len._4_4_ = SUB84(local_170._0_8_,4);
    linearizationWarning(this,msg_02);
    if (local_178 != (undefined1  [8])((long)local_170 + 8)) {
      operator_delete((void *)local_178,(ulong)(local_170._8_8_ + 1));
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8,local_d8 + 1);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
    if (local_128 != &local_118) {
      operator_delete(local_128,local_118 + 1);
    }
    if (local_108 != (QPDFObjGen)&local_f8) {
      operator_delete((void *)local_108,local_f8 + 1);
    }
    _Var26._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  if ((_Var26._M_head_impl)->uncompressed_after_compressed == true) {
    msg_03._M_str =
         "linearized file contains an uncompressed object after a compressed one in a cross-reference stream"
    ;
    msg_03._M_len = 0x62;
    linearizationWarning(this,msg_03);
    _Var26._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  }
  local_170._16_8_ = local_170;
  local_170._0_8_ = local_170._0_8_ & 0xffffffff00000000;
  local_170._8_8_ = (_Base_ptr)0x0;
  local_150 = 0;
  p_Var13 = *(_Base_ptr *)((long)&((_Var26._M_head_impl)->xref_table)._M_t._M_impl + 0x18);
  p_Var3 = (_Rb_tree_header *)((long)&((_Var26._M_head_impl)->xref_table)._M_t._M_impl + 8);
  local_158 = (QPDFObjGen)local_170._16_8_;
  if ((_Rb_tree_header *)p_Var13 != p_Var3) {
    do {
      iVar8 = QPDFXRefEntry::getType((QPDFXRefEntry *)&p_Var13[1]._M_parent);
      if (iVar8 == 2) {
        iVar8 = QPDFXRefEntry::getObjStreamNumber((QPDFXRefEntry *)&p_Var13[1]._M_parent);
        local_148 = (ulong *)CONCAT44(local_148._4_4_,p_Var13[1]._M_color);
        pmVar12 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)local_178,(key_type *)&local_148);
        *pmVar12 = iVar8;
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var3);
  }
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  optimize_internal<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  local_178,false,(function<int_(QPDFObjectHandle_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  calculateLinearizationData<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
            (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                  local_178);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_178);
  _Var26._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pQVar25 = *(pointer *)
             &((_Var26._M_head_impl)->part6).
              super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
  pQVar14 = *(pointer *)((long)&(_Var26._M_head_impl)->part6 + 8);
  if (pQVar25 == pQVar14) {
    local_178 = (undefined1  [8])((long)local_170 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,"linearization part 6 unexpectedly empty","");
    stopOnError(this,(string *)local_178);
    if (local_178 != (undefined1  [8])((long)local_170 + 8)) {
      operator_delete((void *)local_178,(ulong)(local_170._8_8_ + 1));
    }
    _Var26._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    pQVar25 = *(pointer *)
               &((_Var26._M_head_impl)->part6).
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>;
    pQVar14 = *(pointer *)((long)&(_Var26._M_head_impl)->part6 + 8);
  }
  if (pQVar25 == pQVar14) {
    uVar28 = 0xffffffffffffffff;
    pMVar23 = (Members *)0xffffffffffffffff;
  }
  else {
    uVar24 = 0xffffffffffffffff;
    pMVar20 = (Members *)0xffffffffffffffff;
    do {
      local_178 = (undefined1  [8])QPDFObjectHandle::getObjGen(pQVar25);
      _Var26._M_head_impl =
           (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
      cVar15 = std::
               _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDF::ObjCache>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
               ::find(&((_Var26._M_head_impl)->obj_cache)._M_t,(key_type *)local_178);
      if (cVar15._M_node == (_Base_ptr)((long)&(_Var26._M_head_impl)->obj_cache + 8U)) {
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_02,"linearization part6 object not in cache");
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pmVar16 = std::
                map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                ::operator[](&((this->m)._M_t.
                               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                               .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                              obj_cache,(key_type *)local_178);
      uVar28 = pmVar16->end_before_space;
      if (pmVar16->end_before_space < (long)uVar24) {
        uVar28 = uVar24;
      }
      pMVar23 = (Members *)pmVar16->end_after_space;
      if ((long)pmVar16->end_after_space < (long)pMVar20) {
        pMVar23 = pMVar20;
      }
      pQVar25 = pQVar25 + 1;
      uVar24 = uVar28;
      pMVar20 = pMVar23;
    } while (pQVar25 != pQVar14);
  }
  uVar24 = (local_c8->linp).first_page_end;
  if ((long)uVar24 <= (long)pMVar23 && (long)uVar28 <= (long)uVar24) goto LAB_0021365c;
  uVar21 = -uVar24;
  if (0 < (long)uVar24) {
    uVar21 = uVar24;
  }
  uVar27 = 1;
  if (9 < uVar21) {
    uVar19 = uVar21;
    uVar5 = 4;
    do {
      uVar27 = uVar5;
      if (uVar19 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_00213128;
      }
      if (uVar19 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_00213128;
      }
      if (uVar19 < 10000) goto LAB_00213128;
      bVar1 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      uVar5 = uVar27 + 4;
    } while (bVar1);
    uVar27 = uVar27 + 1;
  }
LAB_00213128:
  local_78[0] = local_68;
  local_c8 = pMVar23;
  std::__cxx11::string::_M_construct((ulong)local_78,(char)uVar27 - (char)((long)uVar24 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_78[0] - ((long)uVar24 >> 0x3f)),uVar27,uVar21);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x27e67d);
  local_e8 = &local_d8;
  puVar17 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar17) {
    local_d8 = *puVar17;
    lStack_d0 = plVar9[3];
  }
  else {
    local_d8 = *puVar17;
    local_e8 = (ulong *)*plVar9;
  }
  local_e0 = plVar9[1];
  *plVar9 = (long)puVar17;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  pQVar10 = (QPDFObjGen *)std::__cxx11::string::append((char *)&local_e8);
  QVar18 = (QPDFObjGen)(pQVar10 + 2);
  if (*pQVar10 == QVar18) {
    local_f8 = *(ulong *)QVar18;
    QStack_f0 = pQVar10[3];
    local_108 = (QPDFObjGen)&local_f8;
  }
  else {
    local_f8 = *(ulong *)QVar18;
    local_108 = *pQVar10;
  }
  local_100 = pQVar10[1];
  *pQVar10 = QVar18;
  pQVar10[1].obj = 0;
  pQVar10[1].gen = 0;
  *(undefined1 *)&pQVar10[2].obj = 0;
  uVar24 = -uVar28;
  if (0 < (long)uVar28) {
    uVar24 = uVar28;
  }
  uVar27 = 1;
  if (9 < uVar24) {
    uVar21 = uVar24;
    uVar5 = 4;
    do {
      uVar27 = uVar5;
      if (uVar21 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_002132a2;
      }
      if (uVar21 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_002132a2;
      }
      if (uVar21 < 10000) goto LAB_002132a2;
      bVar1 = 99999 < uVar21;
      uVar21 = uVar21 / 10000;
      uVar5 = uVar27 + 4;
    } while (bVar1);
    uVar27 = uVar27 + 1;
  }
LAB_002132a2:
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar27 - (char)((long)uVar28 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_b8 - ((long)uVar28 >> 0x3f)),uVar27,uVar24);
  uVar28 = 0xf;
  if (local_108 != (QPDFObjGen)&local_f8) {
    uVar28 = local_f8;
  }
  if (uVar28 < (ulong)(local_b0 + (long)local_100)) {
    uVar28 = 0xf;
    if (local_b8 != local_a8) {
      uVar28 = local_a8[0];
    }
    if (uVar28 < (ulong)(local_b0 + (long)local_100)) goto LAB_0021333c;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_108);
  }
  else {
LAB_0021333c:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_b8);
  }
  plVar9 = puVar11 + 2;
  if ((long *)*puVar11 == plVar9) {
    local_118 = *plVar9;
    uStack_110 = puVar11[3];
    local_128 = &local_118;
  }
  else {
    local_118 = *plVar9;
    local_128 = (long *)*puVar11;
  }
  local_120 = puVar11[1];
  *puVar11 = plVar9;
  puVar11[1] = 0;
  *(undefined1 *)plVar9 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_148 = &local_138;
  puVar17 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar17) {
    local_138 = *puVar17;
    lStack_130 = plVar9[3];
  }
  else {
    local_138 = *puVar17;
    local_148 = (ulong *)*plVar9;
  }
  local_140 = plVar9[1];
  *plVar9 = (long)puVar17;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  pMVar23 = (Members *)-(long)local_c8;
  if (0 < (long)local_c8) {
    pMVar23 = local_c8;
  }
  uVar27 = 1;
  if ((Members *)0x9 < pMVar23) {
    pMVar20 = pMVar23;
    uVar5 = 4;
    do {
      uVar27 = uVar5;
      if (pMVar20 < (Members *)0x64) {
        uVar27 = uVar27 - 2;
        goto LAB_00213469;
      }
      if (pMVar20 < (Members *)0x3e8) {
        uVar27 = uVar27 - 1;
        goto LAB_00213469;
      }
      if (pMVar20 < (Members *)0x2710) goto LAB_00213469;
      bVar1 = (Members *)0x1869f < pMVar20;
      pMVar20 = (Members *)((ulong)pMVar20 / 10000);
      uVar5 = uVar27 + 4;
    } while (bVar1);
    uVar27 = uVar27 + 1;
  }
LAB_00213469:
  lVar2 = (long)local_c8 >> 0x3f;
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar27 - (char)((long)local_c8 >> 0x3f))
  ;
  std::__detail::__to_chars_10_impl<unsigned_long_long>
            ((char *)((long)local_98 - lVar2),uVar27,(unsigned_long_long)pMVar23);
  uVar28 = 0xf;
  if (local_148 != &local_138) {
    uVar28 = local_138;
  }
  if (uVar28 < (ulong)(local_90 + local_140)) {
    uVar28 = 0xf;
    if (local_98 != local_88) {
      uVar28 = local_88[0];
    }
    if (uVar28 < (ulong)(local_90 + local_140)) goto LAB_002134f8;
    pQVar10 = (QPDFObjGen *)
              std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_148);
  }
  else {
LAB_002134f8:
    pQVar10 = (QPDFObjGen *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_98);
  }
  QVar18 = (QPDFObjGen)(pQVar10 + 2);
  if (*pQVar10 == QVar18) {
    local_170._8_8_ = *(undefined8 *)QVar18;
    local_170._16_8_ = pQVar10[3];
    local_178 = (undefined1  [8])((long)local_170 + 8);
  }
  else {
    local_170._8_8_ = *(undefined8 *)QVar18;
    local_178 = (undefined1  [8])*pQVar10;
  }
  local_170._0_8_ = pQVar10[1];
  *pQVar10 = QVar18;
  pQVar10[1].obj = 0;
  pQVar10[1].gen = 0;
  *(undefined1 *)QVar18 = 0;
  msg_04._M_str = (char *)local_178;
  msg_04._M_len._0_4_ = (int)local_170._0_8_;
  msg_04._M_len._4_4_ = SUB84(local_170._0_8_,4);
  linearizationWarning(this,msg_04);
  if (local_178 != (undefined1  [8])((long)local_170 + 8)) {
    operator_delete((void *)local_178,(ulong)(local_170._8_8_ + 1));
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  if (local_108 != (QPDFObjGen)&local_f8) {
    operator_delete((void *)local_108,local_f8 + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
LAB_0021365c:
  pvVar4 = local_c0;
  local_170._0_8_ = local_170._0_8_ & 0xffffffff00000000;
  local_170._8_8_ = (_Base_ptr)0x0;
  local_170._16_8_ = local_170;
  local_150 = 0;
  local_158 = (QPDFObjGen)local_170._16_8_;
  checkHSharedObject(this,local_c0,
                     (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     local_178);
  checkHPageOffset(this,pvVar4,
                   (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_178);
  checkHOutlines(this);
  bVar1 = ((this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
           _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
           super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->linearization_warnings;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_178);
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool
QPDF::checkLinearizationInternal()
{
    // All comments referring to the PDF spec refer to the spec for version 1.4.

    // Check all values in linearization parameter dictionary

    LinParameters& p = m->linp;

    // L: file size in bytes -- checked by isLinearized

    // O: object number of first page
    std::vector<QPDFObjectHandle> const& pages = getAllPages();
    if (p.first_page_object != pages.at(0).getObjectID()) {
        QTC::TC("qpdf", "QPDF err /O mismatch");
        linearizationWarning("first page object (/O) mismatch");
    }

    // N: number of pages
    int npages = toI(pages.size());
    if (p.npages != npages) {
        // Not tested in the test suite
        linearizationWarning("page count (/N) mismatch");
    }

    for (size_t i = 0; i < toS(npages); ++i) {
        QPDFObjectHandle const& page = pages.at(i);
        QPDFObjGen og(page.getObjGen());
        if (m->xref_table[og].getType() == 2) {
            linearizationWarning(
                "page dictionary for page " + std::to_string(i) + " is compressed");
        }
    }

    // T: offset of whitespace character preceding xref entry for object 0
    m->file->seek(p.xref_zero_offset, SEEK_SET);
    while (true) {
        char ch;
        m->file->read(&ch, 1);
        if (!((ch == ' ') || (ch == '\r') || (ch == '\n'))) {
            m->file->seek(-1, SEEK_CUR);
            break;
        }
    }
    if (m->file->tell() != m->first_xref_item_offset) {
        QTC::TC("qpdf", "QPDF err /T mismatch");
        linearizationWarning(
            "space before first xref item (/T) mismatch (computed = " +
            std::to_string(m->first_xref_item_offset) +
            "; file = " + std::to_string(m->file->tell()));
    }

    // P: first page number -- Implementation note 124 says Acrobat ignores this value, so we will
    // too.

    // Check numbering of compressed objects in each xref section. For linearized files, all
    // compressed objects are supposed to be at the end of the containing xref section if any object
    // streams are in use.

    if (m->uncompressed_after_compressed) {
        linearizationWarning(
            "linearized file contains an uncompressed object after a compressed "
            "one in a cross-reference stream");
    }

    // Further checking requires optimization and order calculation. Don't allow optimization to
    // make changes.  If it has to, then the file is not properly linearized.  We use the xref table
    // to figure out which objects are compressed and which are uncompressed.
    { // local scope
        std::map<int, int> object_stream_data;
        for (auto const& iter: m->xref_table) {
            QPDFObjGen const& og = iter.first;
            QPDFXRefEntry const& entry = iter.second;
            if (entry.getType() == 2) {
                object_stream_data[og.getObj()] = entry.getObjStreamNumber();
            }
        }
        optimize_internal(object_stream_data, false, nullptr);
        calculateLinearizationData(object_stream_data);
    }

    // E: offset of end of first page -- Implementation note 123 says Acrobat includes on extra
    // object here by mistake.  pdlin fails to place thumbnail images in section 9, so when
    // thumbnails are present, it also gets the wrong value for /E.  It also doesn't count outlines
    // here when it should even though it places them in part 6.  This code fails to put thread
    // information dictionaries in part 9, so it actually gets the wrong value for E when threads
    // are present.  In that case, it would probably agree with pdlin.  As of this writing, the test
    // suite doesn't contain any files with threads.

    if (m->part6.empty()) {
        stopOnError("linearization part 6 unexpectedly empty");
    }
    qpdf_offset_t min_E = -1;
    qpdf_offset_t max_E = -1;
    for (auto const& oh: m->part6) {
        QPDFObjGen og(oh.getObjGen());
        if (m->obj_cache.count(og) == 0) {
            // All objects have to have been dereferenced to be classified.
            throw std::logic_error("linearization part6 object not in cache");
        }
        ObjCache const& oc = m->obj_cache[og];
        min_E = std::max(min_E, oc.end_before_space);
        max_E = std::max(max_E, oc.end_after_space);
    }
    if ((p.first_page_end < min_E) || (p.first_page_end > max_E)) {
        QTC::TC("qpdf", "QPDF warn /E mismatch");
        linearizationWarning(
            "end of first page section (/E) mismatch: /E = " + std::to_string(p.first_page_end) +
            "; computed = " + std::to_string(min_E) + ".." + std::to_string(max_E));
    }

    // Check hint tables

    std::map<int, int> shared_idx_to_obj;
    checkHSharedObject(pages, shared_idx_to_obj);
    checkHPageOffset(pages, shared_idx_to_obj);
    checkHOutlines();

    return !m->linearization_warnings;
}